

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

Abc_ZddMan * Abc_ZddManAlloc(int nVars,int nObjs)

{
  int iVar1;
  Abc_ZddMan *p_00;
  int *piVar2;
  Abc_ZddEnt *pAVar3;
  Abc_ZddObj *pAVar4;
  int local_1c;
  int i;
  Abc_ZddMan *p;
  int nObjs_local;
  int nVars_local;
  
  p_00 = (Abc_ZddMan *)calloc(1,0x60);
  p_00->nVars = nVars;
  p_00->nObjsAlloc = nObjs;
  iVar1 = Abc_Base2Log(nObjs);
  p_00->nUniqueMask = (1 << ((byte)iVar1 & 0x1f)) - 1;
  iVar1 = Abc_Base2Log(nObjs);
  p_00->nCacheMask = (1 << ((byte)iVar1 & 0x1f)) - 1;
  piVar2 = (int *)calloc((ulong)(p_00->nUniqueMask + 1),4);
  p_00->pUnique = piVar2;
  piVar2 = (int *)calloc((long)p_00->nObjsAlloc,4);
  p_00->pNexts = piVar2;
  pAVar3 = (Abc_ZddEnt *)calloc((ulong)(p_00->nCacheMask + 1),0x10);
  p_00->pCache = pAVar3;
  pAVar4 = (Abc_ZddObj *)calloc((long)p_00->nObjsAlloc,0xc);
  p_00->pObjs = pAVar4;
  p_00->nObjs = 2;
  memset(p_00->pObjs,0xff,0x18);
  *(uint *)p_00->pObjs = *(uint *)p_00->pObjs & 0x80000000 | nVars & 0x7fffffffU;
  *(uint *)(p_00->pObjs + 1) = *(uint *)(p_00->pObjs + 1) & 0x80000000 | nVars & 0x7fffffffU;
  for (local_1c = 0; local_1c < nVars; local_1c = local_1c + 1) {
    Abc_ZddUniqueCreate(p_00,local_1c,1,0);
  }
  if (p_00->nObjs == nVars + 2) {
    p_00->nMemory =
         (ulong)p_00->nUniqueMask + 0x19 + (long)p_00->nObjsAlloc +
         (((ulong)(p_00->nCacheMask + 1) << 4) >> 2) + ((ulong)((long)p_00->nObjsAlloc * 0xc) >> 2);
    return p_00;
  }
  __assert_fail("p->nObjs == nVars + 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                ,0xca,"Abc_ZddMan *Abc_ZddManAlloc(int, int)");
}

Assistant:

Abc_ZddMan * Abc_ZddManAlloc( int nVars, int nObjs )
{
    Abc_ZddMan * p; int i;
    p = ABC_CALLOC( Abc_ZddMan, 1 );
    p->nVars       = nVars;
    p->nObjsAlloc  = nObjs;
    p->nUniqueMask = (1 << Abc_Base2Log(nObjs)) - 1;
    p->nCacheMask  = (1 << Abc_Base2Log(nObjs)) - 1;
    p->pUnique     = ABC_CALLOC( int, p->nUniqueMask + 1 );
    p->pNexts      = ABC_CALLOC( int, p->nObjsAlloc );
    p->pCache      = ABC_CALLOC( Abc_ZddEnt, p->nCacheMask + 1 );
    p->pObjs       = ABC_CALLOC( Abc_ZddObj, p->nObjsAlloc );
    p->nObjs       = 2;
    memset( p->pObjs, 0xff, sizeof(Abc_ZddObj) * 2 );
    p->pObjs[0].Var = nVars;
    p->pObjs[1].Var = nVars;
    for ( i = 0; i < nVars; i++ )
        Abc_ZddUniqueCreate( p, i, 1, 0 );
    assert( p->nObjs == nVars + 2 );
    p->nMemory = sizeof(Abc_ZddMan)/4 + 
        p->nUniqueMask + 1 + p->nObjsAlloc + 
        (p->nCacheMask + 1) * sizeof(Abc_ZddEnt)/4 + 
        p->nObjsAlloc * sizeof(Abc_ZddObj)/4;
    return p;
}